

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)

{
  bool bVar1;
  SQInteger SVar2;
  HSQUIRRELVM in_RDX;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *arr;
  SQChar *in_stack_ffffffffffffffd8;
  SQRESULT local_8;
  
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 1) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    local_8 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(v,idx,newsize._4_4_,(SQObjectPtr **)arr);
    if (bVar1) {
      if ((long)in_RDX < 0) {
        local_8 = sq_throwerror(in_RDX,in_stack_ffffffffffffffd8);
      }
      else {
        SQArray::Resize((SQArray *)idx,newsize);
        local_8 = 0;
      }
    }
    else {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

SQRESULT sq_arrayresize(HSQUIRRELVM v,SQInteger idx,SQInteger newsize)
{
    sq_aux_paramscheck(v,1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(newsize >= 0) {
        _array(*arr)->Resize(newsize);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("negative size"));
}